

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall
TPZAnalysis::PostProcessErrorSerial
          (TPZAnalysis *this,TPZVec<double> *ervec,bool store_error,ostream *out)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  
  TPZCompMesh::EvaluateError(this->fCompMesh,store_error,ervec);
  uVar1 = (uint)ervec->fNElements;
  if ((int)uVar1 < 3) {
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar2 = std::operator<<(poVar2,"TPZAnalysis::PostProcess - At least 3 norms are expected.");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::endl<char,std::char_traits<char>>(out);
    poVar2 = std::operator<<(poVar2,"############");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      poVar2 = std::endl<char,std::char_traits<char>>(out);
      poVar2 = std::operator<<(poVar2,"error ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar4);
      std::operator<<(poVar2,"  = ");
      std::ostream::_M_insert<double>(ervec->fStore[uVar4]);
    }
  }
  return;
}

Assistant:

void TPZAnalysis::PostProcessErrorSerial(TPZVec<REAL> &ervec, bool store_error, std::ostream &out ){

    fCompMesh->EvaluateError(store_error, ervec);


    const int nerrors = ervec.NElements();

    if (nerrors < 3) {
        PZError << endl << "TPZAnalysis::PostProcess - At least 3 norms are expected." << endl;
        out<<endl<<"############"<<endl;
        for(int ier = 0; ier < nerrors; ier++)
            out << endl << "error " << ier << "  = " << ervec[ier];
    }
    else {
#ifdef PZDEBUG
        out << "############" << endl;
        out << "Norma H1 or L2 -> p = " << ervec[0] << std::endl;
        out << "Norma L2 or L2 -> u = " << ervec[1] << std::endl;
        out << "Semi-norma H1 or L2 -> div = " << ervec[2] << std::endl;
        for (int ier = 3; ier < ervec.size(); ier++)
            out << "other norms = " << ervec[ier] << std::endl;
#endif
    }
}